

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

wchar_t motion_dir(loc start,loc finish)

{
  _Bool _Var1;
  undefined4 local_1c;
  undefined4 uStack_18;
  loc finish_local;
  loc start_local;
  
  _Var1 = loc_eq(start,finish);
  if (_Var1) {
    start_local.x = 5;
  }
  else {
    finish_local.x = start.x;
    local_1c = finish.x;
    finish_local.y = start.y;
    uStack_18 = finish.y;
    if (finish_local.x == local_1c) {
      start_local.x = 8;
      if (finish_local.y < uStack_18) {
        start_local.x = 2;
      }
    }
    else if (finish_local.y == uStack_18) {
      start_local.x = 4;
      if (finish_local.x < local_1c) {
        start_local.x = 6;
      }
    }
    else if (finish_local.y < uStack_18) {
      start_local.x = 1;
      if (finish_local.x < local_1c) {
        start_local.x = 3;
      }
    }
    else if (uStack_18 < finish_local.y) {
      start_local.x = 7;
      if (finish_local.x < local_1c) {
        start_local.x = 9;
      }
    }
    else {
      start_local.x = 5;
    }
  }
  return start_local.x;
}

Assistant:

int motion_dir(struct loc start, struct loc finish)
{
	/* No movement required */
	if (loc_eq(start, finish)) return (DIR_NONE);

	/* South or North */
	if (start.x == finish.x) return ((start.y < finish.y) ? DIR_S : DIR_N);

	/* East or West */
	if (start.y == finish.y) return ((start.x < finish.x) ? DIR_E : DIR_W);

	/* South-east or South-west */
	if (start.y < finish.y) return ((start.x < finish.x) ? DIR_SE : DIR_SW);

	/* North-east or North-west */
	if (start.y > finish.y) return ((start.x < finish.x) ? DIR_NE : DIR_NW);

	/* Paranoia */
	return (DIR_NONE);
}